

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> * __thiscall
QPDFPageObjectHelper::getAnnotations
          (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           *__return_storage_ptr__,QPDFPageObjectHelper *this,string *only_subtype)

{
  bool bVar1;
  int iVar2;
  char *__end;
  int iVar3;
  QPDFObjectHandle annot;
  QPDFObjectHandle annots;
  string local_80;
  vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *local_60;
  string local_58;
  string *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_dataplus._M_p =
       (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58._M_string_length =
       (size_type)
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length)->_M_use_count
           + 1;
    }
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60 = (vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *)
             __return_storage_ptr__;
  local_38 = only_subtype;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/Annots","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_58.field_2,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
  }
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_58.field_2);
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&local_58.field_2);
    if (0 < iVar2) {
      iVar3 = 0;
      do {
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_58,(int)&local_58 + 0x10);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
        bVar1 = QPDFObjectHandle::isDictionaryOfType
                          ((QPDFObjectHandle *)&local_58,&local_80,local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (bVar1) {
          std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
          emplace_back<QPDFObjectHandle&>(local_60,(QPDFObjectHandle *)&local_58);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
        }
        iVar3 = iVar3 + 1;
      } while (iVar2 != iVar3);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.field_2._8_8_);
  }
  return (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)local_60
  ;
}

Assistant:

std::vector<QPDFAnnotationObjectHelper>
QPDFPageObjectHelper::getAnnotations(std::string const& only_subtype)
{
    std::vector<QPDFAnnotationObjectHelper> result;
    QPDFObjectHandle annots = oh().getKey("/Annots");
    if (annots.isArray()) {
        int nannots = annots.getArrayNItems();
        for (int i = 0; i < nannots; ++i) {
            QPDFObjectHandle annot = annots.getArrayItem(i);
            if (annot.isDictionaryOfType("", only_subtype)) {
                result.emplace_back(annot);
            }
        }
    }
    return result;
}